

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  HashBucket *__s;
  String local_e0;
  bool local_c1;
  HashBucket *pHStack_c0;
  bool _kj_shouldLog;
  HashBucket *newBucket;
  HashBucket *pHStack_b0;
  uint i;
  HashBucket *oldBucket;
  HashBucket *__end2;
  HashBucket *__begin2;
  ArrayPtr<const_kj::_::HashBucket> *__range2;
  uint local_88;
  uint collisionCount;
  uint entryCount;
  size_t size;
  Fault local_68;
  Fault f;
  unsigned_long *local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  size_t targetSize_local;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets_local;
  Array<kj::_::HashBucket> *newBuckets;
  
  _kjCondition._32_8_ = oldBuckets.size_;
  oldBuckets_local.ptr = oldBuckets.ptr;
  targetSize_local = (size_t)this;
  oldBuckets_local.size_ = (size_t)__return_storage_ptr__;
  local_58 = (unsigned_long *)
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&MAGIC_ASSERT,(unsigned_long *)&_kjCondition.result)
  ;
  f.exception._4_4_ = 0x40000000;
  DebugExpression<unsigned_long&>::operator<
            ((DebugComparison<unsigned_long_&,_int> *)local_50,
             (DebugExpression<unsigned_long&> *)&local_58,(int *)((long)&f.exception + 4));
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar2) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[36]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x47,FAILED,"targetSize < (1 << 30)",
               "_kjCondition,\"hash table has reached maximum size\"",
               (DebugComparison<unsigned_long_&,_int> *)local_50,
               (char (*) [36])"hash table has reached maximum size");
    Debug::Fault::fatal(&local_68);
  }
  sVar3 = chooseHashTableSize(_kjCondition._32_4_);
  _entryCount = sVar3;
  sVar4 = ArrayPtr<const_kj::_::HashBucket>::size
                    ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
  if (sVar3 < sVar4) {
    _entryCount = ArrayPtr<const_kj::_::HashBucket>::size
                            ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
  }
  collisionCount._3_1_ = 0;
  heapArray<kj::_::HashBucket>(__return_storage_ptr__,_entryCount);
  __s = Array<kj::_::HashBucket>::begin(__return_storage_ptr__);
  memset(__s,0,_entryCount << 3);
  local_88 = 0;
  __range2._4_4_ = 0;
  __begin2 = (HashBucket *)&targetSize_local;
  __end2 = ArrayPtr<const_kj::_::HashBucket>::begin((ArrayPtr<const_kj::_::HashBucket> *)__begin2);
  oldBucket = ArrayPtr<const_kj::_::HashBucket>::end((ArrayPtr<const_kj::_::HashBucket> *)__begin2);
  for (; __end2 != oldBucket; __end2 = __end2 + 1) {
    pHStack_b0 = __end2;
    bVar2 = HashBucket::isOccupied(__end2);
    if (bVar2) {
      local_88 = local_88 + 1;
      uVar1 = pHStack_b0->hash;
      sVar3 = Array<kj::_::HashBucket>::size(__return_storage_ptr__);
      newBucket._4_4_ = (uint)((ulong)uVar1 % sVar3);
      while( true ) {
        pHStack_c0 = Array<kj::_::HashBucket>::operator[]
                               (__return_storage_ptr__,(ulong)newBucket._4_4_);
        bVar2 = HashBucket::isEmpty(pHStack_c0);
        if (bVar2) break;
        __range2._4_4_ = __range2._4_4_ + 1;
        sVar3 = probeHash(__return_storage_ptr__,(ulong)newBucket._4_4_);
        newBucket._4_4_ = (uint)sVar3;
      }
      *pHStack_c0 = *pHStack_b0;
    }
  }
  if ((local_88 * 4 + 0x10 < __range2._4_4_) && ((rehash::warned & 1U) == 0)) {
    local_c1 = Debug::shouldLog(WARNING);
    while (local_c1 != false) {
      getStackTrace();
      Debug::log<char_const(&)[71],unsigned_int&,unsigned_int&,kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x67,WARNING,
                 "\"detected excessive collisions in hash table; is your hash function OK?\", entryCount, collisionCount, kj::getStackTrace()"
                 ,(char (*) [71])
                  "detected excessive collisions in hash table; is your hash function OK?",&local_88
                 ,(uint *)((long)&__range2 + 4),&local_e0);
      String::~String(&local_e0);
      local_c1 = false;
    }
    rehash::warned = true;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  uint entryCount = 0;
  uint collisionCount = 0;

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      ++entryCount;
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
        ++collisionCount;
      }
    }
  }

  if (collisionCount > 16 + entryCount * 4) {
    static bool warned = false;
    if (!warned) {
      KJ_LOG(WARNING, "detected excessive collisions in hash table; is your hash function OK?",
          entryCount, collisionCount, kj::getStackTrace());
      warned = true;
    }
  }

  return newBuckets;
}